

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

void av1_pick_uniform_tx_size_type_yrd
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bs,int64_t ref_best_rd)

{
  uint8_t *puVar1;
  _Bool _Var2;
  TX_MODE tx_mode;
  BLOCK_SIZE bsize;
  MB_MODE_INFO *pMVar3;
  byte *above_ctx;
  byte *left_ctx;
  MB_MODE_INFO *pMVar4;
  bool bVar5;
  undefined8 uVar6;
  int64_t iVar7;
  int64_t iVar8;
  undefined7 uVar9;
  byte bVar10;
  uint32_t hash;
  int32_t iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  TX_SIZE *pTVar15;
  long lVar16;
  int (*paiVar17) [3];
  int (*paiVar18) [2];
  long lVar19;
  size_t __n;
  byte *pbVar20;
  ulong uVar21;
  long lVar22;
  uint is_inter;
  ulong uVar23;
  int n4;
  byte bVar24;
  ulong uVar25;
  byte bVar26;
  long lVar27;
  int64_t iVar28;
  MB_RD_RECORD *mb_rd_record;
  byte tx_size;
  byte local_931;
  long local_8f8;
  MB_MODE_INFO *mbmi;
  RD_STATS local_8b8;
  int (*local_890) [3];
  byte *local_888;
  MB_MODE_INFO *local_880;
  int (*local_878) [2];
  long local_870;
  ulong local_868;
  int64_t dist;
  int64_t rd [3];
  uint8_t best_blk_skip [1024];
  uint8_t best_txk_type_map [1024];
  
  pMVar3 = *(x->e_mbd).mi;
  bVar5 = true;
  if ((pMVar3->field_0xa7 & 0x80) == 0) {
    bVar5 = '\0' < pMVar3->ref_frame[0];
  }
  iVar14 = (x->e_mbd).mi_row;
  iVar12 = (x->e_mbd).mi_col;
  rd_stats->rate = 0;
  rd_stats->zero_rate = 0;
  rd_stats->sse = 0;
  rd_stats->dist = 0;
  rd_stats->rdcost = 0;
  rd_stats->skip_txfm = '\x01';
  n4 = 1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bs] - 4 & 0x1f);
  __n = (size_t)n4;
  if (bVar5) {
    if (((((cpi->sf).rd_sf.use_mb_rd_hash == 0) || (iVar14 < (x->e_mbd).tile.mi_row_start)) ||
        ((x->e_mbd).tile.mi_row_end <=
         (int)(iVar14 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [bs]))) ||
       ((iVar12 < (x->e_mbd).tile.mi_col_start ||
        ((x->e_mbd).tile.mi_col_end <=
         (int)(iVar12 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [bs]))))) {
      mb_rd_record = (MB_RD_RECORD *)0x0;
      hash = 0;
    }
    else {
      hash = get_block_residue_hash(x,bs);
      mb_rd_record = (x->txfm_search_info).mb_rd_record;
      iVar11 = find_mb_rd_info(mb_rd_record,ref_best_rd,hash);
      if (iVar11 != -1) {
        pMVar3 = *(x->e_mbd).mi;
        puVar1 = mb_rd_record->mb_rd_info[iVar11].blk_skip;
        pMVar3->tx_size = ((MB_RD_INFO *)(puVar1 + -0x11))->tx_size;
        memcpy((x->txfm_search_info).blk_skip,puVar1,__n);
        uVar6 = *(undefined8 *)(puVar1 + -8);
        *(undefined8 *)pMVar3->inter_tx_size = *(undefined8 *)(puVar1 + -0x10);
        *(undefined8 *)(pMVar3->inter_tx_size + 8) = uVar6;
        memcpy((x->e_mbd).tx_type_map,mb_rd_record->mb_rd_info[iVar11].tx_type_map,__n);
        iVar14 = mb_rd_record->mb_rd_info[iVar11].rd_stats.zero_rate;
        iVar28 = mb_rd_record->mb_rd_info[iVar11].rd_stats.dist;
        iVar7 = mb_rd_record->mb_rd_info[iVar11].rd_stats.rdcost;
        iVar8 = mb_rd_record->mb_rd_info[iVar11].rd_stats.sse;
        rd_stats->rate = mb_rd_record->mb_rd_info[iVar11].rd_stats.rate;
        rd_stats->zero_rate = iVar14;
        rd_stats->dist = iVar28;
        rd_stats->rdcost = iVar7;
        rd_stats->sse = iVar8;
        uVar9 = *(undefined7 *)&mb_rd_record->mb_rd_info[iVar11].rd_stats.field_0x21;
        rd_stats->skip_txfm = mb_rd_record->mb_rd_info[iVar11].rd_stats.skip_txfm;
        *(undefined7 *)&rd_stats->field_0x21 = uVar9;
        return;
      }
    }
    if ((((x->txfm_search_params).skip_txfm_level != 0) &&
        ((x->e_mbd).lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0)) &&
       (iVar14 = predict_skip_txfm(x,bs,&dist,(uint)(cpi->common).features.reduced_tx_set_used),
       iVar14 != 0)) {
      set_skip_txfm(x,rd_stats,bs,dist);
      goto LAB_00217899;
    }
  }
  else {
    hash = 0;
    mb_rd_record = (MB_RD_RECORD *)0x0;
  }
  if ((x->e_mbd).lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0) {
    uVar13 = (uint)(x->txfm_search_params).tx_size_search_method;
    if (uVar13 != 2) {
      rd_stats->rate = 0x7fffffff;
      rd_stats->zero_rate = 0;
      rd_stats->dist = 0x7fffffffffffffff;
      rd_stats->rdcost = 0x7fffffffffffffff;
      rd_stats->sse = 0x7fffffffffffffff;
      rd_stats->skip_txfm = '\0';
      local_880 = *(x->e_mbd).mi;
      local_931 = ""[bs];
      tx_mode = (x->txfm_search_params).tx_mode_search_type;
      iVar14 = 2;
      if (tx_mode == '\x02') {
        if ((local_880->field_0xa7 & 0x80) == 0) {
          is_inter = (uint)('\0' < local_880->ref_frame[0]);
        }
        else {
          is_inter = 1;
        }
        iVar12 = get_search_init_depth
                           ((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                  [bs],
                            (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                  [bs],is_inter,&cpi->sf,uVar13);
        bVar10 = local_931;
        if (((iVar12 == 2) && (iVar12 = iVar14, (cpi->oxcf).txfm_cfg.enable_tx64 == false)) &&
           ((0x61810UL >> ((ulong)local_931 & 0x3f) & 1) != 0)) {
          bVar10 = ""[local_931];
        }
      }
      else {
        bVar10 = tx_size_from_tx_mode(bs,tx_mode);
        iVar12 = iVar14;
      }
      local_888 = "" + bs;
      x->rd_model = '\0';
      rd[0] = 0x7fffffffffffffff;
      rd[1] = 0x7fffffffffffffff;
      rd[2] = 0x7fffffffffffffff;
      local_878 = (x->mode_costs).txfm_partition_cost;
      puVar1 = (x->txfm_search_info).blk_skip;
      local_890 = (x->mode_costs).switchable_interp_costs + 0xd;
      local_8f8 = 0x7fffffffffffffff;
      uVar23 = (ulong)(uint)bVar10;
      lVar16 = (long)iVar12;
      local_870 = lVar16;
      for (; lVar16 < 3; lVar16 = lVar16 + 1) {
        if ((((cpi->oxcf).txfm_cfg.enable_tx64 != false) ||
            ((0x61810UL >> (uVar23 & 0x3f) & 1) == 0)) &&
           (((cpi->oxcf).txfm_cfg.enable_rect_tx != false ||
            (tx_size_wide[uVar23] == tx_size_high[uVar23])))) {
          if ((x->txfm_search_params).nn_prune_depths_for_intra_tx == '\x02') break;
          (x->txfm_search_params).enable_nn_prune_intra_tx_depths =
               (_Bool)((uint)uVar23 == (uint)bVar10 & (cpi->sf).tx_sf.prune_intra_tx_depths_using_nn
                      );
          iVar28 = ref_best_rd;
          if (local_8f8 < ref_best_rd) {
            iVar28 = local_8f8;
          }
          if ((cpi->sf).tx_sf.use_rd_based_breakout_for_intra_tx_search == false) {
            iVar28 = ref_best_rd;
          }
          pMVar3 = *(x->e_mbd).mi;
          bVar5 = true;
          if ((pMVar3->field_0xa7 & 0x80) == 0) {
            bVar5 = '\0' < pMVar3->ref_frame[0];
          }
          tx_size = (byte)uVar23;
          iVar14 = 0;
          if ((x->txfm_search_params).tx_mode_search_type == '\x02') {
            bsize = pMVar3->bsize;
            iVar14 = 0;
            if ((ulong)bsize != 0) {
              above_ctx = (x->e_mbd).above_txfm_context;
              left_ctx = (x->e_mbd).left_txfm_context;
              if (bVar5) {
                iVar14 = txfm_partition_context(above_ctx,left_ctx,bsize,tx_size);
                paiVar18 = local_878 + iVar14;
              }
              else {
                if (bs == BLOCK_4X4) goto LAB_00217bb5;
                paiVar17 = local_890 +
                           (ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[bs] * 5;
                for (pbVar20 = local_888; *pbVar20 != tx_size; pbVar20 = "" + *pbVar20) {
                  paiVar17 = (int (*) [3])(*paiVar17 + 1);
                }
                uVar21 = (ulong)(x->e_mbd).up_available;
                bVar26 = *above_ctx;
                if ((uVar21 == 1) &&
                   ((pMVar4 = (x->e_mbd).above_mbmi, (pMVar4->field_0xa7 & 0x80) != 0 ||
                    ('\0' < pMVar4->ref_frame[0])))) {
                  bVar26 = block_size_wide[pMVar4->bsize];
                }
                uVar25 = (ulong)(x->e_mbd).left_available;
                bVar24 = *left_ctx;
                if ((uVar25 != 0) &&
                   ((pMVar4 = (x->e_mbd).left_mbmi, (pMVar4->field_0xa7 & 0x80) != 0 ||
                    ('\0' < pMVar4->ref_frame[0])))) {
                  bVar24 = block_size_high[pMVar4->bsize];
                }
                if ((tx_size_high[""[bsize]] <= (int)(uint)bVar24) < uVar25) {
                  uVar25 = (ulong)(tx_size_high[""[bsize]] <= (int)(uint)bVar24);
                }
                if ((tx_size_wide[""[bsize]] <= (int)(uint)bVar26) < uVar21) {
                  uVar21 = (ulong)(tx_size_wide[""[bsize]] <= (int)(uint)bVar26);
                }
                paiVar18 = (int (*) [2])((long)paiVar17 + (uVar21 + uVar25) * 0x14);
              }
              iVar14 = (*paiVar18)[0];
            }
          }
LAB_00217bb5:
          local_868 = uVar23;
          uVar13 = av1_get_skip_txfm_context(&x->e_mbd);
          lVar27 = (long)(x->mode_costs).skip_txfm_cost[uVar13][1];
          if (bVar5) {
            lVar22 = (long)x->rdmult;
            lVar19 = lVar22 * lVar27 + 0x100 >> 9;
          }
          else {
            lVar22 = (long)x->rdmult;
            lVar19 = 0x7fffffffffffffff;
          }
          iVar12 = (x->mode_costs).skip_txfm_cost[uVar13][0] + iVar14;
          lVar22 = iVar12 * lVar22 + 0x100 >> 9;
          pMVar3->tx_size = tx_size;
          if (lVar19 <= lVar22) {
            lVar22 = lVar19;
          }
          av1_txfm_rd_in_plane(x,cpi,&local_8b8,iVar28,lVar22,0,bs,tx_size,'\0',0);
          if (local_8b8.rate == 0x7fffffff) {
            lVar19 = 0x7fffffffffffffff;
            rd[lVar16] = 0x7fffffffffffffff;
          }
          else {
            if (local_8b8.skip_txfm == '\0' || !bVar5) {
              lVar19 = local_8b8.dist * 0x80 +
                       ((long)(iVar12 + local_8b8.rate) * (long)x->rdmult + 0x100 >> 9);
              local_8b8.rate = iVar14 + local_8b8.rate;
              if (((local_8b8.skip_txfm == '\0' && bVar5) &&
                  ((x->e_mbd).lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0)) &&
                 (lVar27 = local_8b8.sse * 0x80 + (x->rdmult * lVar27 + 0x100 >> 9),
                 lVar27 <= lVar19)) {
                local_8b8.rate = 0;
                local_8b8.dist = local_8b8.sse;
                local_8b8.skip_txfm = '\x01';
                lVar19 = lVar27;
              }
            }
            else {
              lVar19 = local_8b8.sse * 0x80 + (x->rdmult * lVar27 + 0x100 >> 9);
            }
            rd[lVar16] = lVar19;
            if (lVar19 < local_8f8) {
              memcpy(best_blk_skip,puVar1,__n);
              memcpy(best_txk_type_map,(x->e_mbd).tx_type_map,__n);
              rd_stats->rate = local_8b8.rate;
              rd_stats->zero_rate = local_8b8.zero_rate;
              rd_stats->dist = local_8b8.dist;
              rd_stats->rdcost = local_8b8.rdcost;
              rd_stats->sse = local_8b8.sse;
              *(ulong *)&rd_stats->skip_txfm = CONCAT71(local_8b8._33_7_,local_8b8.skip_txfm);
              local_931 = tx_size;
              local_8f8 = lVar19;
            }
          }
          if (((uint)uVar23 == 0) ||
             (((uVar23 = local_868, lVar16 != 2 && local_870 < lVar16 &&
               (x->source_variance < 0x100)) && (rd[lVar16 + -1] < lVar19)))) break;
        }
        uVar23 = (ulong)""[uVar23];
      }
      if (rd_stats->rate != 0x7fffffff) {
        local_880->tx_size = local_931;
        memcpy((x->e_mbd).tx_type_map,best_txk_type_map,__n);
        memcpy(puVar1,best_blk_skip,__n);
      }
      (x->txfm_search_params).nn_prune_depths_for_intra_tx = '\0';
      (x->txfm_search_params).enable_nn_prune_intra_tx_depths = false;
      goto LAB_00217899;
    }
    pMVar3 = *(x->e_mbd).mi;
    bVar10 = tx_size_from_tx_mode(bs,(x->txfm_search_params).tx_mode_search_type);
    pMVar3->tx_size = bVar10;
    _Var2 = (cpi->oxcf).txfm_cfg.enable_rect_tx;
    if ((cpi->oxcf).txfm_cfg.enable_tx64 == false) {
      if (_Var2 == false) {
        pTVar15 = choose_largest_tx_size_tx_size_max_32_square;
      }
      else {
        pTVar15 = choose_largest_tx_size_tx_size_max_32;
      }
LAB_002177fd:
      bVar10 = pTVar15[bVar10];
      pMVar3->tx_size = bVar10;
    }
    else if (_Var2 == false) {
      pTVar15 = "";
      goto LAB_002177fd;
    }
    uVar13 = av1_get_skip_txfm_context(&x->e_mbd);
    if (((pMVar3->field_0xa7 & 0x80) == 0) && (pMVar3->ref_frame[0] < '\x01')) {
      lVar16 = 0x7fffffffffffffff;
      lVar27 = (long)x->rdmult;
    }
    else {
      lVar27 = (long)x->rdmult;
      lVar16 = (x->mode_costs).skip_txfm_cost[uVar13][1] * lVar27 + 0x100 >> 9;
    }
    iVar28 = lVar27 * (x->mode_costs).skip_txfm_cost[uVar13][0] + 0x100 >> 9;
    if (lVar16 <= iVar28) {
      iVar28 = lVar16;
    }
  }
  else {
    (*(x->e_mbd).mi)->tx_size = '\0';
    bVar10 = 0;
    iVar28 = 0;
  }
  av1_txfm_rd_in_plane(x,cpi,rd_stats,ref_best_rd,iVar28,0,bs,bVar10,'\0',0);
LAB_00217899:
  if (mb_rd_record == (MB_RD_RECORD *)0x0) {
    return;
  }
  save_mb_rd_info(n4,hash,x,rd_stats,mb_rd_record);
  return;
}

Assistant:

void av1_pick_uniform_tx_size_type_yrd(const AV1_COMP *const cpi, MACROBLOCK *x,
                                       RD_STATS *rd_stats, BLOCK_SIZE bs,
                                       int64_t ref_best_rd) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const TxfmSearchParams *tx_params = &x->txfm_search_params;
  assert(bs == mbmi->bsize);
  const int is_inter = is_inter_block(mbmi);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  av1_init_rd_stats(rd_stats);

  // Hashing based speed feature for inter blocks. If the hash of the residue
  // block is found in the table, use previously saved search results and
  // terminate early.
  uint32_t hash = 0;
  MB_RD_RECORD *mb_rd_record = NULL;
  const int num_blks = bsize_to_num_blk(bs);
  if (is_inter && cpi->sf.rd_sf.use_mb_rd_hash) {
    const int within_border =
        mi_row >= xd->tile.mi_row_start &&
        (mi_row + mi_size_high[bs] < xd->tile.mi_row_end) &&
        mi_col >= xd->tile.mi_col_start &&
        (mi_col + mi_size_wide[bs] < xd->tile.mi_col_end);
    if (within_border) {
      hash = get_block_residue_hash(x, bs);
      mb_rd_record = x->txfm_search_info.mb_rd_record;
      const int match_index = find_mb_rd_info(mb_rd_record, ref_best_rd, hash);
      if (match_index != -1) {
        MB_RD_INFO *mb_rd_info = &mb_rd_record->mb_rd_info[match_index];
        fetch_mb_rd_info(num_blks, mb_rd_info, rd_stats, x);
        return;
      }
    }
  }

  // If we predict that skip is the optimal RD decision - set the respective
  // context and terminate early.
  int64_t dist;
  if (tx_params->skip_txfm_level && is_inter &&
      !xd->lossless[mbmi->segment_id] &&
      predict_skip_txfm(x, bs, &dist,
                        cpi->common.features.reduced_tx_set_used)) {
    // Populate rdstats as per skip decision
    set_skip_txfm(x, rd_stats, bs, dist);
    // Save the RD search results into mb_rd_record.
    if (mb_rd_record) {
      save_mb_rd_info(num_blks, hash, x, rd_stats, mb_rd_record);
    }
    return;
  }

  if (xd->lossless[mbmi->segment_id]) {
    // Lossless mode can only pick the smallest (4x4) transform size.
    choose_smallest_tx_size(cpi, x, rd_stats, ref_best_rd, bs);
  } else if (tx_params->tx_size_search_method == USE_LARGESTALL) {
    choose_largest_tx_size(cpi, x, rd_stats, ref_best_rd, bs);
  } else {
    choose_tx_size_type_from_rd(cpi, x, rd_stats, ref_best_rd, bs);
  }

  // Save the RD search results into mb_rd_record for possible reuse in future.
  if (mb_rd_record) {
    save_mb_rd_info(num_blks, hash, x, rd_stats, mb_rd_record);
  }
}